

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O2

void __thiscall
ExecutorTest_LambdaContextCapture_Test::~ExecutorTest_LambdaContextCapture_Test
          (ExecutorTest_LambdaContextCapture_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExecutorTest, LambdaContextCapture)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let m: f32 = 1;
    let f: function = \(y: f32, z: f32): f32 = { ret y + z + m; };
    m = 2;
    print("" : f(2, 2));
    ret 0;
  }
  )SRC";

  std::string expected = "5.000000\n";

  testProgram(source, expected, 0);
}